

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGXMLScanner.cpp
# Opt level: O1

bool __thiscall
xercesc_4_0::SGXMLScanner::normalizeAttValue
          (SGXMLScanner *this,XMLAttDef *attDef,XMLCh *attName,XMLCh *value,XMLBuffer *toFill)

{
  XMLSize_t XVar1;
  XMLByte *pXVar2;
  bool bVar3;
  AttTypes AVar4;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  XMLCh XVar8;
  bool bVar9;
  
  if (attDef == (XMLAttDef *)0x0) {
    AVar4 = AttTypes_Min;
  }
  else {
    AVar4 = attDef->fType;
  }
  toFill->fIndex = 0;
  bVar9 = true;
  if ((attDef != (XMLAttDef *)0x0) && (attDef->fExternalAttribute == true)) {
    bVar9 = (uint)(AVar4 + ~NmTokens) < 0xfffffff9;
  }
  bVar6 = true;
  if (AVar4 < Enumeration && AVar4 != AttTypes_Min) {
    bVar3 = false;
    do {
      bVar7 = false;
      while( true ) {
        while( true ) {
          XVar8 = *value;
          uVar5 = (ulong)(ushort)XVar8;
          if (XVar8 == L'<') {
            bVar6 = false;
            XMLScanner::emitError
                      (&this->super_XMLScanner,BracketInAttrValue,attName,(XMLCh *)0x0,(XMLCh *)0x0,
                       (XMLCh *)0x0);
          }
          else if (XVar8 == L'\xffff') {
            uVar5 = (ulong)(ushort)value[1];
            value = value + 1;
          }
          else if (XVar8 == L'\0') {
            return bVar6;
          }
          if (bVar7) break;
          pXVar2 = ((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable;
          if (-1 < (char)pXVar2[uVar5]) goto LAB_002bc38e;
          value = value + 1;
          bVar7 = true;
          if ((((this->super_XMLScanner).fStandalone == true) &&
              ((this->super_XMLScanner).fValidate == true && !bVar9)) &&
             ((!bVar3 ||
              ((((XMLCh)uVar5 != L' ' && ((ulong)(ushort)*value != 0)) &&
               ((char)pXVar2[(ushort)*value] < '\0')))))) {
            XMLValidator::emitError
                      ((this->super_XMLScanner).fValidator,NoAttNormForStandalone,attName,
                       (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
          }
        }
        if (-1 < (char)((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable[uVar5])
        break;
        value = value + 1;
        bVar7 = true;
      }
      if (bVar3) {
        if (toFill->fIndex == toFill->fCapacity) {
          XMLBuffer::ensureCapacity(toFill,1);
        }
        XVar1 = toFill->fIndex;
        toFill->fIndex = XVar1 + 1;
        toFill->fBuffer[XVar1] = L' ';
      }
LAB_002bc38e:
      if (toFill->fIndex == toFill->fCapacity) {
        XMLBuffer::ensureCapacity(toFill,1);
      }
      XVar1 = toFill->fIndex;
      toFill->fIndex = XVar1 + 1;
      toFill->fBuffer[XVar1] = (XMLCh)uVar5;
      value = value + 1;
      bVar3 = true;
    } while( true );
  }
  do {
    XVar8 = *value;
    if (XVar8 == L'\xffff') {
      XVar8 = value[1];
      value = value + 1;
    }
    else {
      if (XVar8 == L'\0') {
        return bVar6;
      }
      if ((ushort)XVar8 < 0xe) {
        if (1 < (ushort)XVar8 - 9) {
          if (XVar8 == L'<') goto LAB_002bc20b;
          if (XVar8 != L'\r') goto LAB_002bc228;
        }
        XVar8 = L' ';
        if (((this->super_XMLScanner).fStandalone == true) &&
           ((this->super_XMLScanner).fValidate == true && !bVar9)) {
          XMLValidator::emitError
                    ((this->super_XMLScanner).fValidator,NoAttNormForStandalone,attName,(XMLCh *)0x0
                     ,(XMLCh *)0x0,(XMLCh *)0x0);
        }
      }
      else if (XVar8 == L'<') {
LAB_002bc20b:
        bVar6 = false;
        XMLScanner::emitError
                  (&this->super_XMLScanner,BracketInAttrValue,attName,(XMLCh *)0x0,(XMLCh *)0x0,
                   (XMLCh *)0x0);
      }
    }
LAB_002bc228:
    if (toFill->fIndex == toFill->fCapacity) {
      XMLBuffer::ensureCapacity(toFill,1);
    }
    XVar1 = toFill->fIndex;
    toFill->fIndex = XVar1 + 1;
    toFill->fBuffer[XVar1] = XVar8;
    value = value + 1;
  } while( true );
}

Assistant:

bool SGXMLScanner::normalizeAttValue( const   XMLAttDef* const    attDef
                                      , const XMLCh* const        attName
                                      , const XMLCh* const        value
                                      ,       XMLBuffer&          toFill)
{
    // A simple state value for a whitespace processing state machine
    enum States
    {
        InWhitespace
        , InContent
    };

    // Get the type and name
    const XMLAttDef::AttTypes type = (attDef)
                            ?attDef->getType()
                            :XMLAttDef::CData;

    // Assume its going to go fine, and empty the target buffer in preperation
    bool retVal = true;
    toFill.reset();

    // check to see if it's a tokenized type that is declared externally 
    bool  isAttTokenizedExternal = (attDef)
                                   ?attDef->isExternal() && (type == XMLAttDef::ID || 
                                                             type == XMLAttDef::IDRef || 
                                                             type == XMLAttDef::IDRefs || 
                                                             type == XMLAttDef::Entity || 
                                                             type == XMLAttDef::Entities || 
                                                             type == XMLAttDef::NmToken || 
                                                             type == XMLAttDef::NmTokens)
                                   :false;

    //  Loop through the chars of the source value and normalize it according
    //  to the type.
    States curState = InContent;
    bool firstNonWS = false;
    XMLCh nextCh;
    const XMLCh* srcPtr = value;

    if (type == XMLAttDef::CData || type > XMLAttDef::Notation) {
        while (*srcPtr) {
            //  Get the next character from the source. We have to watch for
            //  escaped characters (which are indicated by a 0xFFFF value followed
            //  by the char that was escaped.)
            nextCh = *srcPtr;

            // Do we have an escaped character ?
            if (nextCh == 0xFFFF)
            {
                nextCh = *++srcPtr;
            }
            else if ( (nextCh <= 0x0D) && (nextCh == 0x09 || nextCh == 0x0A || nextCh == 0x0D) ) {
                // Check Validity Constraint for Standalone document declaration
                // XML 1.0, Section 2.9
                if (fStandalone && fValidate && isAttTokenizedExternal)
                {
                     // Can't have a standalone document declaration of "yes" if  attribute
                     // values are subject to normalisation
                     fValidator->emitError(XMLValid::NoAttNormForStandalone, attName);
                }
                nextCh = chSpace;
            }
            else if (nextCh == chOpenAngle) {
                //  If its not escaped, then make sure its not a < character, which is
                //  not allowed in attribute values.
                emitError(XMLErrs::BracketInAttrValue, attName);
                retVal = false;
            }

            // Add this char to the target buffer
            toFill.append(nextCh);

            // And move up to the next character in the source
            srcPtr++;
        }
    }
    else {
        while (*srcPtr)
        {
            //  Get the next character from the source. We have to watch for
            //  escaped characters (which are indicated by a 0xFFFF value followed
            //  by the char that was escaped.)
            nextCh = *srcPtr;

            // Do we have an escaped character ?
            if (nextCh == 0xFFFF)
            {
                nextCh = *++srcPtr;
            }
            else if (nextCh == chOpenAngle) {
                //  If its not escaped, then make sure its not a < character, which is
                //  not allowed in attribute values.
                emitError(XMLErrs::BracketInAttrValue, attName);
                retVal = false;
            }

            if (curState == InWhitespace)
            {
                if (!fReaderMgr.getCurrentReader()->isWhitespace(nextCh))
                {
                    if (firstNonWS)
                        toFill.append(chSpace);
                    curState = InContent;
                    firstNonWS = true;
                }
                else
                {
                    srcPtr++;
                    continue;
                }
            }
            else if (curState == InContent)
            {
                if (fReaderMgr.getCurrentReader()->isWhitespace(nextCh))
                {
                    curState = InWhitespace;
                    srcPtr++;

                    // Check Validity Constraint for Standalone document declaration
                    // XML 1.0, Section 2.9
                    if (fStandalone && fValidate && isAttTokenizedExternal)
                    {
                        if (!firstNonWS || (nextCh != chSpace && *srcPtr && fReaderMgr.getCurrentReader()->isWhitespace(*srcPtr)))
                        {
                            // Can't have a standalone document declaration of "yes" if  attribute
                            // values are subject to normalisation
                            fValidator->emitError(XMLValid::NoAttNormForStandalone, attName);
                        }
                    }
                    continue;
                }
                firstNonWS = true;
            }

            // Add this char to the target buffer
            toFill.append(nextCh);

            // And move up to the next character in the source
            srcPtr++;
        }
    }

    return retVal;
}